

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int __thiscall CGraph::solve(CGraph *this,int room)

{
  pointer pCVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int iVar5;
  
  iVar5 = (this->m_weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[room];
  if (iVar5 != -1) {
    return iVar5;
  }
  pCVar1 = (this->m_building).super__Vector_base<CGraph::CNode,_std::allocator<CGraph::CNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar5 = pCVar1[room].m_weight;
  poVar4 = std::operator<<((ostream *)&std::cerr,"tn ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,room);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,pCVar1[room].m_next1);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,pCVar1[room].m_next2);
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar3 = pCVar1[room].m_next2;
  if (pCVar1[room].m_next1 == 0) {
    if (iVar3 == 0) goto LAB_00102a1b;
    iVar3 = solve(this,iVar3);
  }
  else {
    iVar2 = solve(this,pCVar1[room].m_next1);
    if (iVar3 == 0) {
      iVar5 = iVar5 + iVar2;
      goto LAB_00102a1b;
    }
    iVar3 = solve(this,pCVar1[room].m_next2);
    if (iVar3 < iVar2) {
      iVar3 = iVar2;
    }
  }
  iVar5 = iVar5 + iVar3;
LAB_00102a1b:
  poVar4 = std::operator<<((ostream *)&std::cerr,"fr ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,room);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  (this->m_weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[room] = iVar5;
  return iVar5;
}

Assistant:

int solve(int room) const
        {
            if (-1 != m_weights[room])
            {
                return m_weights[room];
            }
            const CNode& n = m_building[room];
            int result = n.weight();
            std::cerr << "tn " << room << " " << n.top() << " " << n.right() << std::endl;
            if (0 == n.top() && 0 != n.right())
            {
                result += solve(n.right());
            } else if (0 != n.top() && 0 == n.right())
            {
                result += solve(n.top());
            } else if (0 != n.top() && 0 != n.right())
            {
                result += std::max(solve(n.top()), solve(n.right()));
            } else  // both is zero
            {
                // nothing
            }
            std::cerr << "fr " << room << " " << result << std::endl;
            m_weights[room] = result;
            return result;
        }